

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O2

void exeperr(voccxdef *ctx,objnum verb,objnum dobj,objnum prep,objnum iobj)

{
  runcxdef *ctx_00;
  
  if (ctx->voccxper2 != 0xffff) {
    runpobj(ctx->voccxrun,iobj);
    runpobj(ctx->voccxrun,prep);
    runpobj(ctx->voccxrun,dobj);
    runpobj(ctx->voccxrun,verb);
    runfn(ctx->voccxrun,ctx->voccxper2,4);
    return;
  }
  vocerr(ctx,0x6e,"I don\'t know how to ");
  runpprop(ctx->voccxrun,(uchar **)0x0,0,0,verb,8,0,0,verb);
  if (dobj == 0xffff) {
    vocerr(ctx,0x70," anything ");
    if (prep == 0xffff) {
      vocerr(ctx,0x71,"to");
    }
    else {
      runpprop(ctx->voccxrun,(uchar **)0x0,0,0,prep,8,0,0,prep);
    }
    vocerr(ctx,0x72," ");
    ctx_00 = ctx->voccxrun;
    dobj = iobj;
  }
  else {
    vocerr(ctx,0x6f," ");
    ctx_00 = ctx->voccxrun;
  }
  runpprop(ctx_00,(uchar **)0x0,0,0,dobj,9,0,0,dobj);
  vocerr(ctx,0x73,".");
  return;
}

Assistant:

static void exeperr(voccxdef *ctx, objnum verb, objnum dobj,
                    objnum prep, objnum iobj)
{
    if (ctx->voccxper2 != MCMONINV)
    {
        runpobj(ctx->voccxrun, iobj);
        runpobj(ctx->voccxrun, prep);
        runpobj(ctx->voccxrun, dobj);
        runpobj(ctx->voccxrun, verb);
        runfn(ctx->voccxrun, ctx->voccxper2, 4);
        return;
    }
    
    vocerr(ctx, VOCERR(110), "I don't know how to ");
    runppr(ctx->voccxrun, verb, PRP_SDESC, 0);
    
    if (dobj != MCMONINV)
    {
        vocerr(ctx, VOCERR(111), " ");
        runppr(ctx->voccxrun, dobj, PRP_THEDESC, 0);
    }
    else
    {
        vocerr(ctx, VOCERR(112), " anything ");
        if (prep != MCMONINV)
            runppr(ctx->voccxrun, prep, PRP_SDESC, 0);
        else
            vocerr(ctx, VOCERR(113), "to");
        vocerr(ctx, VOCERR(114), " ");
        runppr(ctx->voccxrun, iobj, PRP_THEDESC, 0);
    }
    vocerr(ctx, VOCERR(115), ".");
}